

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstree.cpp
# Opt level: O0

bool __thiscall search::BSTNode::erase(BSTNode *this,int key,Record **r)

{
  int iVar1;
  Record *pRStack_40;
  int kk;
  Record *r1;
  BSTNode *su;
  BSTNode *nd;
  Record **r_local;
  BSTNode *pBStack_18;
  int key_local;
  BSTNode *this_local;
  
  nd = (BSTNode *)r;
  r_local._4_4_ = key;
  pBStack_18 = this;
  su = search(this,key);
  if (su == (BSTNode *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    *(Record **)nd = su->record_;
    if ((su->left_ == (BSTNode *)0x0) && (su->right_ == (BSTNode *)0x0)) {
      if (su->parent_->key_ < su->key_) {
        su->parent_->right_ = (BSTNode *)0x0;
      }
      else {
        su->parent_->left_ = (BSTNode *)0x0;
      }
      if (su != (BSTNode *)0x0) {
        operator_delete(su,0x28);
      }
    }
    else if ((su->left_ == (BSTNode *)0x0) && (su->right_ != (BSTNode *)0x0)) {
      if (su->parent_->key_ < su->key_) {
        su->parent_->right_ = su->right_;
      }
      else {
        su->parent_->left_ = su->right_;
      }
      su->right_->parent_ = su->parent_;
      if (su != (BSTNode *)0x0) {
        operator_delete(su,0x28);
      }
    }
    else if ((su->left_ == (BSTNode *)0x0) || (su->right_ != (BSTNode *)0x0)) {
      r1 = successor(su);
      pRStack_40 = (Record *)0x0;
      iVar1 = ((BSTNode *)r1)->key_;
      erase(su,((BSTNode *)r1)->key_,&stack0xffffffffffffffc0);
      su->key_ = iVar1;
      su->record_ = pRStack_40;
    }
    else {
      if (su->parent_->key_ < su->key_) {
        su->parent_->right_ = su->left_;
      }
      else {
        su->parent_->left_ = su->left_;
      }
      su->left_->parent_ = su->parent_;
      if (su != (BSTNode *)0x0) {
        operator_delete(su,0x28);
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool BSTNode::erase(int key, Record*& r)
    {
        BSTNode* nd = search(key);
        if (!nd)
            return false;
        r = nd->record_;
        if (!nd->left_ && !nd->right_)
        {

            if (nd->key_ > nd->parent_->key_)
                nd->parent_->right_ = nullptr;
            else
                nd->parent_->left_ = nullptr;
            delete nd;
        }
        else if (!nd->left_ && nd->right_)
        {
            if (nd->key_ > nd->parent_->key_)
                nd->parent_->right_ = nd->right_;
            else
                nd->parent_->left_ = nd->right_;
            nd->right_->parent_ = nd->parent_;
            delete nd;
        }
        else if (nd->left_ && !nd->right_)
        {
            if (nd->key_ > nd->parent_->key_)
                nd->parent_->right_ = nd->left_;
            else
                nd->parent_->left_ = nd->left_;
            nd->left_->parent_ = nd->parent_;
            delete nd;
        }
        else
        {
            auto su = nd->successor();
            Record* r1 = nullptr;
            int kk = su->key_;
            nd->erase(su->key_, r1);
            nd->key_ = kk;
            nd->record_ = r1;
        }
        return true;
    }